

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PickLoadSigns.cpp
# Opt level: O2

void __thiscall wasm::PickLoadSigns::optimize(PickLoadSigns *this)

{
  Index IVar1;
  Index IVar2;
  uint uVar3;
  pointer pUVar4;
  _Hash_node_base _Var5;
  pointer pUVar6;
  __node_base *p_Var7;
  
  pUVar4 = (this->usages).
           super__Vector_base<wasm::PickLoadSigns::Usage,_std::allocator<wasm::PickLoadSigns::Usage>_>
           ._M_impl.super__Vector_impl_data._M_start;
  p_Var7 = &(this->loads)._M_h._M_before_begin;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    IVar1 = pUVar4[(uint)((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor].totalUsages;
    if (IVar1 != 0) {
      pUVar6 = pUVar4 + (uint)((_Prime_rehash_policy *)(p_Var7 + 2))->_M_max_load_factor;
      IVar2 = pUVar6->signedUsages;
      uVar3 = pUVar6->unsignedUsages;
      if ((((uVar3 + IVar2 == IVar1) &&
           ((_Var5._M_nxt = p_Var7[1]._M_nxt, IVar2 == 0 ||
            (pUVar6->signedBits == (uint)*(byte *)&_Var5._M_nxt[2]._M_nxt << 3)))) &&
          ((uVar3 == 0 || (pUVar6->unsignedBits == (uint)*(byte *)&_Var5._M_nxt[2]._M_nxt << 3))))
         && (*(char *)&_Var5._M_nxt[5]._M_nxt == '\0')) {
        *(bool *)((long)&_Var5._M_nxt[2]._M_nxt + 1) = uVar3 <= IVar2 * 2;
      }
    }
  }
  return;
}

Assistant:

void optimize() {
    // optimize based on the info we saw
    for (auto& [load, index] : loads) {
      auto& usage = usages[index];
      // if we can't optimize, give up
      if (usage.totalUsages == 0 || // no usages, so no idea
          usage.signedUsages + usage.unsignedUsages !=
            usage.totalUsages || // non-sign/unsigned usages, so cannot change
          (usage.signedUsages != 0 &&
           usage.signedBits !=
             load->bytes * 8) || // sign usages exist but the wrong size
          (usage.unsignedUsages != 0 &&
           usage.unsignedBits !=
             load->bytes * 8)) { // unsigned usages exist but the wrong size
        continue;
      }
      // Atomic operations are always unsigned, never signed.
      if (load->isAtomic) {
        continue;
      }
      // we can pick the optimal one. our hope is to remove 2 items per
      // signed use (two shifts), so we factor that in
      load->signed_ = usage.signedUsages * 2 >= usage.unsignedUsages;
    }
  }